

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlDOMWrapAdoptNode(xmlDOMWrapCtxtPtr_conflict ctxt,xmlDocPtr sourceDoc,xmlNodePtr node,
                       xmlDocPtr destDoc,xmlNodePtr destParent,int options)

{
  xmlElementType xVar1;
  bool bVar2;
  int iVar3;
  xmlEntityPtr pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlChar *old_1;
  xmlChar *old;
  xmlEntityPtr ent;
  int adoptStr;
  xmlNodePtr cur;
  int options_local;
  xmlNodePtr destParent_local;
  xmlDocPtr destDoc_local;
  xmlNodePtr node_local;
  xmlDocPtr sourceDoc_local;
  xmlDOMWrapCtxtPtr_conflict ctxt_local;
  
  if ((((node == (xmlNodePtr)0x0) || (node->type == XML_NAMESPACE_DECL)) ||
      (destDoc == (xmlDocPtr)0x0)) ||
     ((destParent != (xmlNodePtr)0x0 && (destParent->doc != destDoc)))) {
    ctxt_local._4_4_ = -1;
  }
  else if (((node->doc == (_xmlDoc *)0x0) || (sourceDoc == (xmlDocPtr)0x0)) ||
          (node->doc == sourceDoc)) {
    node_local = (xmlNodePtr)sourceDoc;
    if (sourceDoc == (xmlDocPtr)0x0) {
      node_local = (xmlNodePtr)node->doc;
    }
    if ((xmlDocPtr)node_local == destDoc) {
      ctxt_local._4_4_ = -1;
    }
    else {
      xVar1 = node->type;
      if ((xVar1 - XML_ELEMENT_NODE < 5) || (xVar1 - XML_PI_NODE < 2)) {
        if ((node->parent != (_xmlNode *)0x0) && (destParent != node->parent)) {
          xmlUnlinkNode(node);
        }
        if (node->type == XML_ELEMENT_NODE) {
          ctxt_local._4_4_ =
               xmlDOMWrapAdoptBranch(ctxt,(xmlDocPtr)node_local,node,destDoc,destParent,options);
        }
        else if (node->type == XML_ATTRIBUTE_NODE) {
          ctxt_local._4_4_ =
               xmlDOMWrapAdoptAttr(ctxt,(xmlDocPtr)node_local,(xmlAttrPtr)node,destDoc,destParent,
                                   options);
        }
        else {
          bVar2 = true;
          node->doc = destDoc;
          if ((node_local != (xmlNodePtr)0x0) && (node_local[1].last == (_xmlNode *)destDoc->dict))
          {
            bVar2 = false;
          }
          xVar1 = node->type;
          if (xVar1 - XML_TEXT_NODE < 2) {
            if ((((bVar2) && (node->content != (xmlChar *)0x0)) && (node_local != (xmlNodePtr)0x0))
               && ((node_local[1].last != (_xmlNode *)0x0 &&
                   (iVar3 = xmlDictOwns((xmlDictPtr)node_local[1].last,node->content), iVar3 != 0)))
               ) {
              if (destDoc->dict == (_xmlDict *)0x0) {
                pxVar6 = xmlStrdup(node->content);
                node->content = pxVar6;
              }
              else {
                pxVar6 = xmlDictLookup(destDoc->dict,node->content,-1);
                node->content = pxVar6;
              }
            }
          }
          else if (xVar1 == XML_ENTITY_REF_NODE) {
            node->content = (xmlChar *)0x0;
            node->children = (_xmlNode *)0x0;
            node->last = (_xmlNode *)0x0;
            if (((destDoc->intSubset != (_xmlDtd *)0x0) || (destDoc->extSubset != (_xmlDtd *)0x0))
               && (pxVar4 = xmlGetDocEntity(destDoc,node->name), pxVar4 != (xmlEntityPtr)0x0)) {
              node->content = pxVar4->content;
              node->children = (_xmlNode *)pxVar4;
              node->last = (_xmlNode *)pxVar4;
            }
            if ((bVar2) && (node->name != (xmlChar *)0x0)) {
              if (destDoc->dict == (_xmlDict *)0x0) {
                if (((node_local != (xmlNodePtr)0x0) && (node_local[1].last != (_xmlNode *)0x0)) &&
                   (iVar3 = xmlDictOwns((xmlDictPtr)node_local[1].last,node->name), iVar3 != 0)) {
                  pxVar6 = xmlStrdup(node->name);
                  node->name = pxVar6;
                }
              }
              else {
                pxVar6 = node->name;
                pxVar5 = xmlDictLookup(destDoc->dict,node->name,-1);
                node->name = pxVar5;
                if (((node_local == (xmlNodePtr)0x0) || (node_local[1].last == (_xmlNode *)0x0)) ||
                   (iVar3 = xmlDictOwns((xmlDictPtr)node_local[1].last,pxVar6), iVar3 == 0)) {
                  (*xmlFree)(pxVar6);
                }
              }
            }
          }
          else if (xVar1 == XML_PI_NODE) {
            if ((bVar2) && (node->name != (xmlChar *)0x0)) {
              if (destDoc->dict == (_xmlDict *)0x0) {
                if (((node_local != (xmlNodePtr)0x0) && (node_local[1].last != (_xmlNode *)0x0)) &&
                   (iVar3 = xmlDictOwns((xmlDictPtr)node_local[1].last,node->name), iVar3 != 0)) {
                  pxVar6 = xmlStrdup(node->name);
                  node->name = pxVar6;
                }
              }
              else {
                pxVar6 = node->name;
                pxVar5 = xmlDictLookup(destDoc->dict,node->name,-1);
                node->name = pxVar5;
                if (((node_local == (xmlNodePtr)0x0) || (node_local[1].last == (_xmlNode *)0x0)) ||
                   (iVar3 = xmlDictOwns((xmlDictPtr)node_local[1].last,pxVar6), iVar3 == 0)) {
                  (*xmlFree)(pxVar6);
                }
              }
            }
            if (((bVar2) && (node->content != (xmlChar *)0x0)) &&
               ((node_local != (xmlNodePtr)0x0 &&
                ((node_local[1].last != (_xmlNode *)0x0 &&
                 (iVar3 = xmlDictOwns((xmlDictPtr)node_local[1].last,node->content), iVar3 != 0)))))
               ) {
              if (destDoc->dict == (_xmlDict *)0x0) {
                pxVar6 = xmlStrdup(node->content);
                node->content = pxVar6;
              }
              else {
                pxVar6 = xmlDictLookup(destDoc->dict,node->content,-1);
                node->content = pxVar6;
              }
            }
          }
          ctxt_local._4_4_ = 0;
        }
      }
      else if (xVar1 == XML_DOCUMENT_FRAG_NODE) {
        ctxt_local._4_4_ = 2;
      }
      else {
        ctxt_local._4_4_ = 1;
      }
    }
  }
  else {
    ctxt_local._4_4_ = -1;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlDOMWrapAdoptNode(xmlDOMWrapCtxtPtr ctxt,
		    xmlDocPtr sourceDoc,
		    xmlNodePtr node,
		    xmlDocPtr destDoc,
		    xmlNodePtr destParent,
		    int options)
{
    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL) ||
        (destDoc == NULL) ||
	((destParent != NULL) && (destParent->doc != destDoc)))
	return(-1);
    /*
    * Check node->doc sanity.
    */
    if ((node->doc != NULL) && (sourceDoc != NULL) &&
	(node->doc != sourceDoc)) {
	/*
	* Might be an XIncluded node.
	*/
	return (-1);
    }
    if (sourceDoc == NULL)
	sourceDoc = node->doc;
    if (sourceDoc == destDoc)
	return (-1);
    switch (node->type) {
	case XML_ELEMENT_NODE:
	case XML_ATTRIBUTE_NODE:
	case XML_TEXT_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_ENTITY_REF_NODE:
	case XML_PI_NODE:
	case XML_COMMENT_NODE:
	    break;
	case XML_DOCUMENT_FRAG_NODE:
	    /* TODO: Support document-fragment-nodes. */
	    return (2);
	default:
	    return (1);
    }
    /*
    * Unlink only if @node was not already added to @destParent.
    */
    if ((node->parent != NULL) && (destParent != node->parent))
	xmlUnlinkNode(node);

    if (node->type == XML_ELEMENT_NODE) {
	    return (xmlDOMWrapAdoptBranch(ctxt, sourceDoc, node,
		    destDoc, destParent, options));
    } else if (node->type == XML_ATTRIBUTE_NODE) {
	    return (xmlDOMWrapAdoptAttr(ctxt, sourceDoc,
		(xmlAttrPtr) node, destDoc, destParent, options));
    } else {
	xmlNodePtr cur = node;
	int adoptStr = 1;

	cur->doc = destDoc;
	/*
	* Optimize string adoption.
	*/
	if ((sourceDoc != NULL) &&
	    (sourceDoc->dict == destDoc->dict))
		adoptStr = 0;
	switch (node->type) {
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
		XML_TREE_ADOPT_STR_2(node->content)
		    break;
	    case XML_ENTITY_REF_NODE:
		/*
		* Remove reference to the entity-node.
		*/
		node->content = NULL;
		node->children = NULL;
		node->last = NULL;
		if ((destDoc->intSubset) || (destDoc->extSubset)) {
		    xmlEntityPtr ent;
		    /*
		    * Assign new entity-node if available.
		    */
		    ent = xmlGetDocEntity(destDoc, node->name);
		    if (ent != NULL) {
			node->content = ent->content;
			node->children = (xmlNodePtr) ent;
			node->last = (xmlNodePtr) ent;
		    }
		}
		XML_TREE_ADOPT_STR(node->name)
		break;
	    case XML_PI_NODE: {
		XML_TREE_ADOPT_STR(node->name)
		XML_TREE_ADOPT_STR_2(node->content)
		break;
	    }
	    default:
		break;
	}
    }
    return (0);
}